

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

GLFWbool flushDisplay(void)

{
  int iVar1;
  pollfd in_RAX;
  int *piVar2;
  pollfd fd;
  pollfd local_28;
  
  local_28 = in_RAX;
  iVar1 = (*_glfw.wl.client.display_flush)(_glfw.wl.display);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    do {
      if (*piVar2 != 0xb) {
        return 0;
      }
      local_28.fd = (*_glfw.wl.client.display_get_fd)(_glfw.wl.display);
      local_28.events = 4;
      local_28.revents = 0;
      do {
        iVar1 = poll(&local_28,1,-1);
        if (iVar1 != -1) goto LAB_00126f4e;
      } while ((*piVar2 == 0xb) || (*piVar2 == 4));
      if (iVar1 == -1) {
        return 0;
      }
LAB_00126f4e:
      iVar1 = (*_glfw.wl.client.display_flush)(_glfw.wl.display);
    } while (iVar1 == -1);
  }
  return 1;
}

Assistant:

static GLFWbool flushDisplay(void)
{
    while (wl_display_flush(_glfw.wl.display) == -1)
    {
        if (errno != EAGAIN)
            return GLFW_FALSE;

        struct pollfd fd = { wl_display_get_fd(_glfw.wl.display), POLLOUT };

        while (poll(&fd, 1, -1) == -1)
        {
            if (errno != EINTR && errno != EAGAIN)
                return GLFW_FALSE;
        }
    }

    return GLFW_TRUE;
}